

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void imtqlx(int n,double *d,double *e,double *z)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ulong uVar6;
  
  if (n != 1) {
    lVar2 = (long)n;
    e[lVar2 + -1] = 0.0;
    if (0 < n) {
      uVar8 = 1;
      iVar9 = 0;
LAB_001cc9d7:
      iVar10 = 0;
      do {
        dVar14 = d[uVar8 - 1];
        uVar6 = uVar8 & 0xffffffff;
        uVar5 = uVar8;
        dVar11 = dVar14;
        if ((long)uVar8 < lVar2) {
          do {
            pdVar1 = d + uVar5;
            uVar6 = uVar5;
            if (ABS(e[uVar5 - 1]) <= (ABS(*pdVar1) + ABS(dVar11)) * 2.220446049250313e-16) break;
            uVar5 = uVar5 + 1;
            uVar6 = (ulong)(uint)n;
            dVar11 = *pdVar1;
          } while ((uint)n != uVar5);
        }
        iVar4 = (int)uVar6;
        if (uVar8 == (uVar6 & 0xffffffff)) goto LAB_001ccc40;
        if (iVar10 == 0x1e) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"IMTQLX - Fatal error!\n");
          std::operator<<((ostream *)&std::cerr,"  Iteration limit exceeded\n");
          exit(1);
        }
        dVar11 = e[uVar8 - 1];
        dVar13 = (d[uVar8] - dVar14) / (dVar11 + dVar11);
        dVar12 = 0.0;
        dVar11 = dVar11 / (ABS(SQRT(dVar13 * dVar13 + 1.0)) *
                           *(double *)(&DAT_002213f0 + (ulong)(dVar13 < 0.0) * 8) + dVar13) +
                 (d[(long)iVar4 + -1] - dVar14);
        if ((int)uVar8 < iVar4) {
          lVar3 = -1;
          dVar13 = 1.0;
          dVar14 = 1.0;
          do {
            dVar13 = dVar13 * e[(long)iVar4 + lVar3 + -1];
            if (ABS(dVar11) <= ABS(dVar13)) {
              dVar16 = dVar11 / dVar13;
              dVar15 = SQRT(dVar16 * dVar16 + 1.0);
              dVar11 = dVar13 * dVar15;
              dVar13 = 1.0 / dVar15;
              dVar16 = dVar16 * dVar13;
            }
            else {
              dVar13 = dVar13 / dVar11;
              dVar16 = SQRT(dVar13 * dVar13 + 1.0);
              dVar11 = dVar11 * dVar16;
              dVar16 = 1.0 / dVar16;
              dVar13 = dVar13 * dVar16;
            }
            dVar14 = dVar14 * e[(long)iVar4 + lVar3 + -1];
            e[iVar4 + lVar3] = dVar11;
            dVar15 = d[iVar4 + lVar3] - dVar12;
            dVar11 = (d[(long)iVar4 + lVar3 + -1] - dVar15) * dVar13 + (dVar16 + dVar16) * dVar14;
            dVar12 = dVar13 * dVar11;
            d[iVar4 + lVar3] = dVar15 + dVar12;
            dVar11 = dVar11 * dVar16 - dVar14;
            dVar14 = z[iVar4 + lVar3];
            z[iVar4 + lVar3] = dVar13 * z[(long)iVar4 + lVar3 + -1] + dVar16 * dVar14;
            z[(long)iVar4 + lVar3 + -1] = z[(long)iVar4 + lVar3 + -1] * dVar16 - dVar14 * dVar13;
            lVar3 = lVar3 + -1;
            dVar14 = dVar16;
          } while (-lVar3 != (ulong)(uint)(iVar4 + iVar9));
          dVar14 = d[uVar8 - 1];
        }
        iVar10 = iVar10 + 1;
        d[uVar8 - 1] = dVar14 - dVar12;
        e[uVar8 - 1] = dVar11;
        e[(long)iVar4 + -1] = 0.0;
      } while( true );
    }
  }
  return;
LAB_001ccc40:
  uVar8 = uVar8 + 1;
  iVar9 = iVar9 + -1;
  if (uVar8 == n + 1) {
    if (iVar4 < 2) {
      return;
    }
    uVar8 = 2;
    do {
      uVar6 = uVar8 - 1;
      dVar14 = d[uVar8 - 2];
      dVar11 = dVar14;
      if (lVar2 < (long)uVar8) {
        uVar5 = uVar6 & 0xffffffff;
      }
      else {
        uVar5 = uVar6 & 0xffffffff;
        uVar7 = uVar8;
        do {
          if (d[uVar7 - 1] < dVar11) {
            uVar5 = uVar7 & 0xffffffff;
            dVar11 = d[uVar7 - 1];
          }
          uVar7 = uVar7 + 1;
        } while (n + 1 != uVar7);
      }
      if (uVar6 != uVar5) {
        lVar3 = (long)(int)uVar5;
        d[lVar3 + -1] = dVar14;
        d[uVar8 - 2] = dVar11;
        dVar14 = z[uVar8 - 2];
        z[uVar8 - 2] = z[lVar3 + -1];
        z[lVar3 + -1] = dVar14;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != iVar4 + 1);
    return;
  }
  goto LAB_001cc9d7;
}

Assistant:

void imtqlx ( int n, double d[], double e[], double z[] )

//****************************************************************************80
//
//  Purpose:
//
//    IMTQLX diagonalizes a symmetric tridiagonal matrix.
//
//  Discussion:
//
//    This routine is a slightly modified version of the EISPACK routine to 
//    perform the implicit QL algorithm on a symmetric tridiagonal matrix. 
//
//    The authors thank the authors of EISPACK for permission to use this
//    routine. 
//
//    It has been modified to produce the product Q' * Z, where Z is an input 
//    vector and Q is the orthogonal matrix diagonalizing the input matrix.  
//    The changes consist (essentially) of applying the orthogonal transformations
//    directly to Z as they are generated.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    08 January 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//    Roger Martin, James Wilkinson,
//    The Implicit QL Algorithm,
//    Numerische Mathematik,
//    Volume 12, Number 5, December 1968, pages 377-383.
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Input/output, double D(N), the diagonal entries of the matrix.
//    On output, the information in D has been overwritten.
//
//    Input/output, double E(N), the subdiagonal entries of the 
//    matrix, in entries E(1) through E(N-1).  On output, the information in
//    E has been overwritten.
//
//    Input/output, double Z(N).  On input, a vector.  On output,
//    the value of Q' * Z, where Q is the matrix that diagonalizes the
//    input symmetric tridiagonal matrix.
//
{
  double b;
  double c;
  double f;
  double g;
  int i;
  int ii;
  int itn = 30;
  int j;
  int k;
  int l;
  int m = 0; // Silence uninitialized warning.
  int mml;
  double p;
  double prec;
  double r;
  double s;

  prec = r8_epsilon ( );

  if ( n == 1 )
  {
    return;
  }

  e[n-1] = 0.0;

  for ( l = 1; l <= n; l++ )
  {
    j = 0;
    for ( ; ; )
    {
      for ( m = l; m <= n; m++ )
      {
        if ( m == n )
        {
          break;
        }

        if ( fabs ( e[m-1] ) <= prec * ( fabs ( d[m-1] ) + fabs ( d[m] ) ) )
        {
          break;
        }
      }
      p = d[l-1];
      if ( m == l )
      {
        break;
      }
      if ( itn <= j )
      {
        std::cerr << "\n";
        std::cerr << "IMTQLX - Fatal error!\n";
        std::cerr << "  Iteration limit exceeded\n";
        exit ( 1 );
      }
      j = j + 1;
      g = ( d[l] - p ) / ( 2.0 * e[l-1] );
      r = sqrt ( g * g + 1.0 );
      g = d[m-1] - p + e[l-1] / ( g + fabs ( r ) * r8_sign ( g ) );
      s = 1.0;
      c = 1.0;
      p = 0.0;
      mml = m - l;

      for ( ii = 1; ii <= mml; ii++ )
      {
        i = m - ii;
        f = s * e[i-1];
        b = c * e[i-1];

        if ( fabs ( g ) <= fabs ( f ) )
        {
          c = g / f;
          r = sqrt ( c * c + 1.0 );
          e[i] = f * r;
          s = 1.0 / r;
          c = c * s;
        }
        else
        {
          s = f / g;
          r = sqrt ( s * s + 1.0 );
          e[i] = g * r;
          c = 1.0 / r;
          s = s * c;
        }
        g = d[i] - p;
        r = ( d[i-1] - g ) * s + 2.0 * c * b;
        p = s * r;
        d[i] = g + p;
        g = c * r - b;
        f = z[i];
        z[i] = s * z[i-1] + c * f;
        z[i-1] = c * z[i-1] - s * f;
      }
      d[l-1] = d[l-1] - p;
      e[l-1] = g;
      e[m-1] = 0.0;
    }
  }
//
//  Sorting.
//
  for ( ii = 2; ii <= m; ii++ )
  {
    i = ii - 1;
    k = i;
    p = d[i-1];

    for ( j = ii; j <= n; j++ )
    {
      if ( d[j-1] < p )
      {
         k = j;
         p = d[j-1];
      }
    }

    if ( k != i )
    {
      d[k-1] = d[i-1];
      d[i-1] = p;
      p = z[i-1];
      z[i-1] = z[k-1];
      z[k-1] = p;
    }
  }
  return;
}